

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Push
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  SnapshotDataType local_110;
  
  paVar1 = &local_110.EntryPointCommand.field_2;
  memset(&local_110,0,0xe8);
  local_110.EntryPointCommand._M_string_length = 0;
  local_110.EntryPointCommand.field_2._M_local_buf[0] = '\0';
  local_110.EntryPointCommand._M_dataplus._M_p = (pointer)paVar1;
  iVar2 = Push_impl(this,it,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.EntryPointCommand._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.EntryPointCommand._M_dataplus._M_p,
                    CONCAT71(local_110.EntryPointCommand.field_2._M_allocated_capacity._1_7_,
                             local_110.EntryPointCommand.field_2._M_local_buf[0]) + 1);
  }
  return iVar2;
}

Assistant:

iterator Push(iterator it)
  {
    return Push_impl(it, T());
  }